

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O0

void CKSYME_STR(Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *ename)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type in_RDI;
  size_type in_stack_00000018;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000020;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(in_stack_00000020,in_stack_00000018);
  pbVar1 = amrex::
           Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](ename,in_RDI);
  std::__cxx11::string::operator=((string *)pbVar1,"H");
  pbVar1 = amrex::
           Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](ename,in_RDI);
  std::__cxx11::string::operator=((string *)pbVar1,"O");
  pbVar1 = amrex::
           Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](ename,in_RDI);
  std::__cxx11::string::operator=((string *)pbVar1,"N");
  return;
}

Assistant:

void
CKSYME_STR(amrex::Vector<std::string>& ename)
{
  ename.resize(3);
  ename[0] = "H";
  ename[1] = "O";
  ename[2] = "N";
}